

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryLocaleCompare(RecyclableObject *function,CallInfo callInfo,...)

{
  Type str1size;
  ScriptContext *pSVar1;
  EngineInterfaceObject *this;
  JavascriptFunction *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  EngineExtensionObjectBase *pEVar7;
  JavascriptLibrary *pJVar8;
  JavascriptLibrary *extraout_RAX;
  char16 *string1;
  char16 *string2;
  ThreadContext *pTVar9;
  int in_stack_00000010;
  Arguments local_70;
  Arguments local_60;
  JavascriptString *local_50;
  JavascriptString *pThis;
  JavascriptString *pThat;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x551,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d24501;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pThat = (JavascriptString *)args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)&pThat,(CallInfo *)&args.super_Arguments.Values)
  ;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x554,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00d24501:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((ulong)pThat & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.prototype.localeCompare");
  }
  GetThisAndSearchStringArguments
            ((ArgumentReader *)&pThat,pSVar1,L"String.prototype.localeCompare",&local_50,&pThis,true
            );
  if ((DAT_015b01f0 != '\x01') || (bVar4 = ScriptContext::IsIntlEnabled(pSVar1), !bVar4))
  goto LAB_00d244b6;
  pJVar8 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  this = (pJVar8->super_JavascriptLibraryBase).engineInterfaceObject.ptr;
  bVar4 = true;
  if (this != (EngineInterfaceObject *)0x0) {
    pEVar7 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
    pJVar2 = *(JavascriptFunction **)&pEVar7[1].hasBytecode;
    if (pJVar2 == (JavascriptFunction *)0x0) {
      JavascriptLibrary::InitializeIntlForStringPrototype
                ((pSVar1->super_ScriptContextBase).javascriptLibrary);
      pJVar2 = *(JavascriptFunction **)&pEVar7[1].hasBytecode;
      pJVar8 = extraout_RAX;
      if (pJVar2 == (JavascriptFunction *)0x0) goto LAB_00d244b1;
      pTVar9 = pSVar1->threadContext;
      bVar4 = pTVar9->reentrancySafeOrHandled;
      pTVar9->reentrancySafeOrHandled = true;
      local_60.Info = (Type)pThat;
      local_60.Values = (Type)args.super_Arguments.Info;
      pJVar8 = (JavascriptLibrary *)JavascriptFunction::CallFunction(pJVar2,&local_60);
    }
    else {
      pTVar9 = pSVar1->threadContext;
      bVar4 = pTVar9->reentrancySafeOrHandled;
      pTVar9->reentrancySafeOrHandled = true;
      local_70.Info = (Type)pThat;
      local_70.Values = (Type)args.super_Arguments.Info;
      pJVar8 = (JavascriptLibrary *)JavascriptFunction::CallFunction(pJVar2,&local_70);
    }
    pTVar9->reentrancySafeOrHandled = bVar4;
    bVar4 = false;
  }
LAB_00d244b1:
  if (!bVar4) {
    return pJVar8;
  }
LAB_00d244b6:
  string1 = GetString(local_50);
  str1size = local_50->m_charLength;
  string2 = GetString(pThis);
  uVar5 = PlatformAgnostic::UnicodeText::LogicalStringCompare
                    (string1,str1size,string2,pThis->m_charLength);
  if (uVar5 != 0xfffffffe) {
    return (Var)((ulong)uVar5 | 0x1000000000000);
  }
  JavascriptError::ThrowRangeError
            ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr,-0x7ff5ffcd,(PCWSTR)0x0);
}

Assistant:

Var JavascriptString::EntryLocaleCompare(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype.localeCompare"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        JavascriptString * pThis;
        JavascriptString * pThat;

        GetThisAndSearchStringArguments(args, scriptContext, _u("String.prototype.localeCompare"), &pThis, &pThat, true);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled())
        {
            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(
                    nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));

#ifdef INTL_WINGLOB
                if (args.Info.Count == 2)
                {
                    auto undefined = scriptContext->GetLibrary()->GetUndefined();
                    CallInfo toPass(callInfo.Flags, 3);
                    ThreadContext *threadContext = scriptContext->GetThreadContext();
                    return threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor,
                        [threadContext, intlExtensionObject, function, toPass, undefined, pThis, pThat]() -> Var
                        {
                            return CALL_ENTRYPOINT(threadContext, intlExtensionObject->EntryIntl_CompareString,
                                function, toPass, undefined, pThis, pThat);
                        }
                    );
                }
#endif

                // Check if String.prototype.localeCompare/Intl.Collator was already initialized
                JavascriptFunction* func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // String.prototype.localeCompare/Intl.Collator was not initialized yet, so we need to manually initialize it here
                scriptContext->GetLibrary()->InitializeIntlForStringPrototype();
                func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        const char16* pThisStr = pThis->GetString();
        int thisStrCount = pThis->GetLength();

        const char16* pThatStr = pThat->GetString();
        int thatStrCount = pThat->GetLength();

        int result = UnicodeText::LogicalStringCompare(pThisStr, thisStrCount, pThatStr, thatStrCount);

        // LogicalStringCompare will return -2 if CompareStringEx fails.
        if (result == -2)
        {
            // TODO there is no spec on the error thrown here.
            // When the support for HR errors is implemented replace this with the same error reported by v5.8
            JavascriptError::ThrowRangeError(function->GetScriptContext(),
                VBSERR_InternalError /* TODO-ERROR: _u("Failed compare operation")*/ );
        }

        return JavascriptNumber::ToVar(result, scriptContext);
    }